

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

dma_memory ixy::memory_allocate_dma(size_t size,bool require_contiguous)

{
  pointer pcVar1;
  bool bVar2;
  uint __val;
  uint uVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  __off_t _Var11;
  ssize_t sVar12;
  ulong *puVar13;
  uint uVar14;
  long *plVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint __len;
  uint uVar19;
  dma_memory dVar20;
  string __str_1;
  uintptr_t phy;
  string __str;
  path path;
  undefined1 local_f8 [32];
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  path local_58;
  
  local_58._M_pathname._M_string_length = 0x10db31;
  debug<ixy::Pair<ixy::None,char_const*>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp",
             0xc,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_58);
  uVar17 = size + 0x1fffff & 0xffffffffffe00000;
  if (0x200000 < uVar17 && require_contiguous) {
    local_58._M_pathname._M_string_length = 0x10db55;
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x15,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_58
              );
  }
  __val = huge_pg_id;
  __len = 1;
  LOCK();
  huge_pg_id = huge_pg_id + 1;
  UNLOCK();
  uVar6 = getpid();
  uVar19 = -uVar6;
  if (0 < (int)uVar6) {
    uVar19 = uVar6;
  }
  if (9 < uVar19) {
    uVar16 = (ulong)uVar19;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar14 = (uint)uVar16;
      if (uVar14 < 100) {
        __len = __len - 2;
        goto LAB_0010a776;
      }
      if (uVar14 < 1000) {
        __len = __len - 1;
        goto LAB_0010a776;
      }
      if (uVar14 < 10000) goto LAB_0010a776;
      uVar16 = uVar16 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar14);
    __len = __len + 1;
  }
LAB_0010a776:
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct((ulong)local_78,(char)__len - (char)((int)uVar6 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar6 >> 0x1f) + (long)local_78[0]),__len,uVar19);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x10db80);
  plVar15 = plVar9 + 2;
  if ((long *)*plVar9 == plVar15) {
    local_88 = *plVar15;
    lStack_80 = plVar9[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar15;
    local_98 = (long *)*plVar9;
  }
  local_90 = plVar9[1];
  *plVar9 = (long)plVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_c8 = *puVar13;
    lStack_c0 = plVar9[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar13;
    local_d8 = (ulong *)*plVar9;
  }
  local_d0 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  cVar5 = '\x01';
  if (9 < __val) {
    uVar19 = __val;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar19 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0010a8b4;
      }
      if (uVar19 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0010a8b4;
      }
      if (uVar19 < 10000) goto LAB_0010a8b4;
      bVar2 = 99999 < uVar19;
      uVar19 = uVar19 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_0010a8b4:
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,local_b0,__val);
  uVar16 = CONCAT44(uStack_ac,local_b0) + local_d0;
  uVar18 = 0xf;
  if (local_d8 != &local_c8) {
    uVar18 = local_c8;
  }
  if (uVar18 < uVar16) {
    uVar18 = 0xf;
    if (local_b8 != local_a8) {
      uVar18 = local_a8[0];
    }
    if (uVar16 <= uVar18) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
      goto LAB_0010a936;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
LAB_0010a936:
  local_f8._0_8_ = local_f8 + 0x10;
  pcVar1 = (pointer)(puVar10 + 2);
  if ((pointer)*puVar10 == pcVar1) {
    local_f8._16_8_ = *(undefined8 *)pcVar1;
    local_f8._24_8_ = puVar10[3];
  }
  else {
    local_f8._16_8_ = *(undefined8 *)pcVar1;
    local_f8._0_8_ = (pointer)*puVar10;
  }
  local_f8._8_8_ = puVar10[1];
  *puVar10 = pcVar1;
  puVar10[1] = 0;
  *pcVar1 = '\0';
  std::filesystem::__cxx11::path::path(&local_58,(string_type *)local_f8,auto_format);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  iVar7 = open(local_58._M_pathname._M_dataplus._M_p,0x42,0x1c0);
  if (iVar7 == -1) {
    local_f8._8_8_ = "failed to open hugetlbfs file, check that /mnt/huge is mounted";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x1e,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8)
    ;
  }
  iVar8 = ftruncate(iVar7,uVar17);
  if (iVar8 == -1) {
    local_f8._8_8_ = "failed to allocate huge page memory, check hugetlbfs configuration";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x22,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8)
    ;
  }
  dVar20.virt = (ulong *)mmap((void *)0x0,uVar17,3,0x40001,iVar7,0);
  if (dVar20.virt == (ulong *)0xffffffffffffffff) {
    local_f8._8_8_ = "failed to mmap huge page";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x28,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8)
    ;
  }
  iVar8 = mlock(dVar20.virt,uVar17);
  if (iVar8 == -1) {
    local_f8._8_8_ = "disable swap for DMA memory";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.cpp"
               ,0x2d,"memory_allocate_dma",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8)
    ;
  }
  close(iVar7);
  unlink(local_58._M_pathname._M_dataplus._M_p);
  local_d8 = dVar20.virt;
  uVar17 = sysconf(0x1e);
  iVar7 = open("/proc/self/pagemap",0);
  if (iVar7 == -1) {
    local_f8._8_8_ = "failed to open pagemap";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x19,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8);
  }
  uVar17 = uVar17 & 0xffffffff;
  _Var11 = lseek(iVar7,((ulong)dVar20.virt / uVar17) * 8,0);
  if (_Var11 == -1) {
    local_f8._8_8_ = "failed to lseek pagemap";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x1e,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8);
  }
  local_98 = (long *)0x0;
  sVar12 = read(iVar7,&local_98,8);
  if (sVar12 == -1) {
    local_f8._8_8_ = "failed to translate address";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x23,"virt_to_phys",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)local_f8);
  }
  close(iVar7);
  plVar9 = local_98;
  puVar13 = dVar20.virt;
  if (local_98 == (long *)0x0) {
    local_f8._8_8_ = "failed to translate virtual address ";
    local_f8._16_8_ = &local_d8;
    local_f8._24_8_ = " to physical address";
    error<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,void*const&>,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/memory.hpp"
               ,0x29,"virt_to_phys",
               (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_void_*const_&>,_const_char_*>_>
                *)local_f8);
    puVar13 = local_d8;
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  dVar20.phy = (ulong)puVar13 % uVar17 + ((ulong)plVar9 & 0x7fffffffffffff) * uVar17;
  return dVar20;
}

Assistant:

auto memory_allocate_dma(size_t size, bool require_contiguous) -> dma_memory {
    debug("allocating dma memory via huge page");
    // round up to multiples of 2 MB if necessary, this is the wasteful part
    // this could be fixed by co-locating allocations on the same page until a request would be too large
    // when fixing this: make sure to align on 128 byte boundaries (82599 dma requirement)
    if (size % HUGE_PAGE_SIZE) {
        size = ((size >> HUGE_PAGE_BITS) + 1) << HUGE_PAGE_BITS;
    }
    if (require_contiguous && size > HUGE_PAGE_SIZE) {
        // this is the place to implement larger contiguous physical mappings if that's ever needed
        error("could not map physically contiguous memory");
    }
    // unique filename, C11 stdatomic.h requires a too recent gcc, we want to support gcc 4.8
    uint32_t id = __sync_fetch_and_add(&huge_pg_id, 1);

    fs::path path{"/mnt/huge/ixy-" + std::to_string(getpid()) + "-" + std::to_string(id)};
    int fd = open(path.c_str(), O_CREAT | O_RDWR, S_IRWXU);

    if (fd == -1) {
        error("failed to open hugetlbfs file, check that /mnt/huge is mounted");
    }

    if (ftruncate(fd, static_cast<off_t>(size)) == -1) {
        error("failed to allocate huge page memory, check hugetlbfs configuration");
    }

    void *virt_addr = mmap(nullptr, size, PROT_READ | PROT_WRITE, MAP_SHARED | MAP_HUGETLB, fd, 0);

    if (virt_addr == MAP_FAILED) {
        error("failed to mmap huge page");
    }

    // never swap out DMA memory
    if (mlock(virt_addr, size) == -1) {
        error("disable swap for DMA memory");
    }

    // don't keep it around in the hugetlbfs
    close(fd);
    unlink(path.c_str());

    return (dma_memory{virt_addr, virt_to_phys(virt_addr)});
}